

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRun
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms,string *additionalDef,bool negativeCompile,bool negativeLink)

{
  undefined8 uVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  reference this_00;
  reference pvVar5;
  long lVar6;
  reference this_01;
  ulong uVar7;
  reference pvVar8;
  byte local_4b9;
  ulong local_430;
  size_t i_2;
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  programs;
  GLuint vao;
  GLuint vbo;
  GLfloat coords [16];
  ulong local_3c0;
  size_t fn;
  undefined1 local_398 [8];
  ostringstream name_1;
  size_t i_1;
  int subroutineFunctionCounter;
  int subroutineTypeCounter;
  undefined1 local_1f0 [8];
  ostringstream name;
  size_t i;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string parentUniformName;
  long ret;
  bool negativeLink_local;
  bool negativeCompile_local;
  string *additionalDef_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  ExplicitUniformLocationCaseBase *this_local;
  
  parentUniformName.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator(&local_59);
  for (name._368_8_ = 0; uVar1 = name._368_8_,
      sVar3 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::size(uniforms), (ulong)uVar1 < sVar3; name._368_8_ = name._368_8_ + 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    poVar4 = std::operator<<((ostream *)local_1f0,"u");
    std::ostream::operator<<(poVar4,name._368_8_);
    this_00 = std::
              vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
              ::operator[](uniforms,name._368_8_);
    std::__cxx11::ostringstream::str();
    anon_unknown_0::Uniform::setName
              (this_00,(string *)local_58,(string *)&subroutineFunctionCounter);
    std::__cxx11::string::~string((string *)&subroutineFunctionCounter);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
  }
  i_1._4_4_ = 0;
  i_1._0_4_ = 0;
  for (name_1._368_8_ = 0; uVar1 = name_1._368_8_,
      sVar3 = std::
              vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              ::size(subroutineUniforms), (ulong)uVar1 < sVar3; name_1._368_8_ = name_1._368_8_ + 1)
  {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_398);
    poVar4 = std::operator<<((ostream *)local_398,"u");
    uVar1 = name_1._368_8_;
    sVar3 = std::
            vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            ::size(uniforms);
    std::ostream::operator<<(poVar4,uVar1 + sVar3);
    pvVar5 = std::
             vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             ::operator[](subroutineUniforms,name_1._368_8_);
    std::__cxx11::ostringstream::str();
    SubroutineUniform::setName(pvVar5,(string *)&fn);
    std::__cxx11::string::~string((string *)&fn);
    pvVar5 = std::
             vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
             ::operator[](subroutineUniforms,name_1._368_8_);
    glcts::(anonymous_namespace)::SubroutineFunctionSet::getTypeName_abi_cxx11_
              ((SubroutineFunctionSet *)pvVar5);
    lVar6 = std::__cxx11::string::size();
    if (lVar6 == 0) {
      pvVar5 = std::
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               ::operator[](subroutineUniforms,name_1._368_8_);
      iVar2 = i_1._4_4_ + 1;
      SubroutineFunctionSet::setTypeName(&pvVar5->functions,i_1._4_4_);
      local_3c0 = 0;
      while( true ) {
        pvVar5 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,name_1._368_8_);
        sVar3 = std::
                vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ::size((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                        *)pvVar5);
        i_1._4_4_ = iVar2;
        if (sVar3 <= local_3c0) break;
        pvVar5 = std::
                 vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                 ::operator[](subroutineUniforms,name_1._368_8_);
        this_01 = std::
                  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                  ::operator[]((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                *)pvVar5,local_3c0);
        SubroutineFunction::setName(this_01,(int)i_1);
        local_3c0 = local_3c0 + 1;
        i_1._0_4_ = (int)i_1 + 1;
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_398);
  }
  coords[10] = -1.0;
  coords[0xb] = 1.0;
  coords[0xc] = 0.0;
  coords[0xd] = 1.0;
  coords[6] = -1.0;
  coords[7] = -1.0;
  coords[8] = 0.0;
  coords[9] = 1.0;
  coords[2] = 1.0;
  coords[3] = 1.0;
  coords[4] = 0.0;
  coords[5] = 1.0;
  _vao = 0xbf8000003f800000;
  coords[0] = 0.0;
  coords[1] = 1.0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,
             (GLuint *)
             ((long)&programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,
             programs.
             super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x8892,0x40,&vao,0x88e4
            );
  glu::CallLogWrapper::glGenVertexArrays
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,
             (GLuint *)
             &programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
             (GLuint)programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,4,0x1406,'\0',0,
             (void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0);
  std::
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ::vector((vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            *)&i_2);
  uVar7 = CreatePrograms(this,(vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                               *)&i_2,uniforms,subroutineUniforms,additionalDef,negativeCompile,
                         negativeLink);
  parentUniformName.field_2._8_8_ = uVar7 | parentUniformName.field_2._8_8_;
  local_430 = 0;
  while( true ) {
    sVar3 = std::
            vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ::size((vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                    *)&i_2);
    local_4b9 = 0;
    if (((local_430 < sVar3) && (local_4b9 = 0, parentUniformName.field_2._8_8_ == 0)) &&
       (local_4b9 = 0, !negativeCompile)) {
      local_4b9 = negativeLink ^ 0xff;
    }
    if ((local_4b9 & 1) == 0) break;
    pvVar8 = std::
             vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
             ::operator[]((vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                           *)&i_2,local_430);
    uVar7 = runExecuteProgram(this,pvVar8,uniforms,subroutineUniforms);
    parentUniformName.field_2._8_8_ = parentUniformName.field_2._8_8_ | uVar7;
    pvVar8 = std::
             vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
             ::operator[]((vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                           *)&i_2,local_430);
    uVar7 = runQueryProgram(this,pvVar8,uniforms,subroutineUniforms);
    parentUniformName.field_2._8_8_ = uVar7 | parentUniformName.field_2._8_8_;
    local_430 = local_430 + 1;
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0);
  DeletePrograms(this,(vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       *)&i_2);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,
             (GLuint *)
             ((long)&programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  glu::CallLogWrapper::glDeleteVertexArrays
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,1,
             (GLuint *)
             &programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar1 = parentUniformName.field_2._8_8_;
  std::
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ::~vector((vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
             *)&i_2);
  std::__cxx11::string::~string((string *)local_58);
  return uVar1;
}

Assistant:

long doRun(std::vector<Uniform>& uniforms, std::vector<SubroutineUniform>& subroutineUniforms,
			   std::string additionalDef = "", bool negativeCompile = false, bool negativeLink = false)
	{
		long		ret				  = NO_ERROR;
		std::string parentUniformName = "";
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i;
			uniforms[i].setName(parentUniformName, name.str());
		}
		int subroutineTypeCounter	 = 0;
		int subroutineFunctionCounter = 0;
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i + uniforms.size();
			subroutineUniforms[i].setName(name.str());
			if (!subroutineUniforms[i].functions.getTypeName().size())
			{
				subroutineUniforms[i].functions.setTypeName(subroutineTypeCounter++);
				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					subroutineUniforms[i].functions.fn[fn].setName(subroutineFunctionCounter++);
				}
			}
		}

		GLfloat coords[] = {
			1.0f, -1.0f, 0.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
		};

		GLuint vbo, vao;
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(coords), coords, GL_STATIC_DRAW);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, NULL);
		glEnableVertexAttribArray(0);

		std::vector<CompiledProgram> programs;
		ret |= CreatePrograms(programs, uniforms, subroutineUniforms, additionalDef, negativeCompile, negativeLink);

		for (size_t i = 0; i < programs.size() && ret == NO_ERROR && !negativeCompile && !negativeLink; i++)
		{
			ret |= runExecuteProgram(programs[i], uniforms, subroutineUniforms);
			ret |= runQueryProgram(programs[i], uniforms, subroutineUniforms);
		}

		glUseProgram(0);

		DeletePrograms(programs);

		glDeleteBuffers(1, &vbo);
		glDeleteVertexArrays(1, &vao);

		return ret;
	}